

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O3

UEnumeration *
ucal_getKeywordValuesForLocale_63(char *param_1,char *locale,UBool commonlyUsed,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode UVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UList *list;
  UChar *us;
  char *pcVar4;
  size_t sVar5;
  UEnumeration *pUVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  ulong uVar8;
  int indexS;
  int32_t len;
  char prefRegion [4];
  int local_44;
  UResourceBundle *local_40;
  undefined4 local_38;
  char local_34 [4];
  
  ulocimp_getRegionForSupplementalData_63(locale,'\x01',local_34,4,status);
  resB = ures_openDirect_63((char *)0x0,"supplementalData",status);
  ures_getByKey_63(resB,"calendarPreferenceData",resB,status);
  resB_00 = ures_getByKey_63(resB,local_34,(UResourceBundle *)0x0,status);
  UVar2 = *status;
  if (resB != (UResourceBundle *)0x0 && UVar2 == U_MISSING_RESOURCE_ERROR) {
    *status = U_ZERO_ERROR;
    resB_00 = ures_getByKey_63(resB,"001",(UResourceBundle *)0x0,status);
    UVar2 = *status;
  }
  if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
    list = ulist_createEmptyList_63(status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      local_38 = (undefined4)CONCAT71(in_register_00000011,commonlyUsed);
      iVar3 = ures_getSize_63(resB_00);
      local_40 = resB_00;
      if (0 < iVar3) {
        indexS = 0;
        do {
          us = ures_getStringByIndex_63(resB_00,indexS,&local_44,status);
          pcVar4 = (char *)uprv_malloc_63((long)local_44 + 1);
          if (pcVar4 == (char *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            break;
          }
          u_UCharsToChars_63(us,pcVar4,local_44);
          pcVar4[local_44] = '\0';
          ulist_addItemEndList_63(list,pcVar4,'\x01',status);
          resB_00 = local_40;
          if (U_ZERO_ERROR < *status) break;
          indexS = indexS + 1;
          iVar3 = ures_getSize_63(local_40);
        } while (indexS < iVar3);
      }
      UVar2 = *status;
      if ((char)local_38 == '\0' && UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar8 = 0;
        do {
          while( true ) {
            pcVar4 = CAL_TYPES[uVar8];
            sVar5 = strlen(pcVar4);
            UVar1 = ulist_containsString_63(list,pcVar4,(int32_t)sVar5);
            if (UVar1 != '\0') break;
            ulist_addItemEndList_63(list,pcVar4,'\0',status);
            UVar2 = *status;
            if ((U_ZERO_ERROR < UVar2) ||
               (uVar7 = (int)uVar8 + 1, uVar8 = (ulong)uVar7, uVar7 == 0x12)) goto LAB_001e4103;
          }
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar7 != 0x12);
        UVar2 = *status;
      }
LAB_001e4103:
      resB_00 = local_40;
      if (U_ZERO_ERROR < UVar2) {
        ulist_deleteList_63(list);
        list = (UList *)0x0;
        resB_00 = local_40;
      }
    }
  }
  else {
    list = (UList *)0x0;
  }
  ures_close_63(resB_00);
  ures_close_63(resB);
  if (list != (UList *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar6 = (UEnumeration *)uprv_malloc_63(0x38);
    if (pUVar6 != (UEnumeration *)0x0) {
      ulist_resetList_63(list);
      pUVar6->baseContext = (void *)0x0;
      pUVar6->context = (void *)0x0;
      pUVar6->reset = ulist_reset_keyword_values_iterator_63;
      pUVar6->uNext = uenum_unextDefault_63;
      pUVar6->next = ulist_next_keyword_value_63;
      pUVar6->close = ulist_close_keyword_values_iterator_63;
      pUVar6->count = ulist_count_keyword_values_63;
      pUVar6->context = list;
      return pUVar6;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
    ulist_deleteList_63(list);
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ucal_getKeywordValuesForLocale(const char * /* key */, const char* locale, UBool commonlyUsed, UErrorCode *status) {
    // Resolve region
    char prefRegion[ULOC_COUNTRY_CAPACITY];
    (void)ulocimp_getRegionForSupplementalData(locale, TRUE, prefRegion, sizeof(prefRegion), status);
    
    // Read preferred calendar values from supplementalData calendarPreference
    UResourceBundle *rb = ures_openDirect(NULL, "supplementalData", status);
    ures_getByKey(rb, "calendarPreferenceData", rb, status);
    UResourceBundle *order = ures_getByKey(rb, prefRegion, NULL, status);
    if (*status == U_MISSING_RESOURCE_ERROR && rb != NULL) {
        *status = U_ZERO_ERROR;
        order = ures_getByKey(rb, "001", NULL, status);
    }

    // Create a list of calendar type strings
    UList *values = NULL;
    if (U_SUCCESS(*status)) {
        values = ulist_createEmptyList(status);
        if (U_SUCCESS(*status)) {
            for (int i = 0; i < ures_getSize(order); i++) {
                int32_t len;
                const UChar *type = ures_getStringByIndex(order, i, &len, status);
                char *caltype = (char*)uprv_malloc(len + 1);
                if (caltype == NULL) {
                    *status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                u_UCharsToChars(type, caltype, len);
                *(caltype + len) = 0;

                ulist_addItemEndList(values, caltype, TRUE, status);
                if (U_FAILURE(*status)) {
                    break;
                }
            }

            if (U_SUCCESS(*status) && !commonlyUsed) {
                // If not commonlyUsed, add other available values
                for (int32_t i = 0; CAL_TYPES[i] != NULL; i++) {
                    if (!ulist_containsString(values, CAL_TYPES[i], (int32_t)uprv_strlen(CAL_TYPES[i]))) {
                        ulist_addItemEndList(values, CAL_TYPES[i], FALSE, status);
                        if (U_FAILURE(*status)) {
                            break;
                        }
                    }
                }
            }
            if (U_FAILURE(*status)) {
                ulist_deleteList(values);
                values = NULL;
            }
        }
    }

    ures_close(order);
    ures_close(rb);

    if (U_FAILURE(*status) || values == NULL) {
        return NULL;
    }

    // Create string enumeration
    UEnumeration *en = (UEnumeration*)uprv_malloc(sizeof(UEnumeration));
    if (en == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        ulist_deleteList(values);
        return NULL;
    }
    ulist_resetList(values);
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    en->context = values;
    return en;
}